

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property_string.c
# Opt level: O0

void property_string_data_free(void *vpropdata)

{
  PROP_TABLE **in_RDI;
  PROPERTY_STRING_DATA *propdata;
  
  if (in_RDI != (PROP_TABLE **)0x0) {
    CRYPTO_THREAD_lock_free((CRYPTO_RWLOCK *)0x2b37aa);
    property_table_free(in_RDI);
    property_table_free(in_RDI);
    *(undefined4 *)((long)in_RDI + 0x1c) = 0;
    *(undefined4 *)(in_RDI + 3) = 0;
    CRYPTO_free(in_RDI);
  }
  return;
}

Assistant:

static void property_string_data_free(void *vpropdata)
{
    PROPERTY_STRING_DATA *propdata = vpropdata;

    if (propdata == NULL)
        return;

    CRYPTO_THREAD_lock_free(propdata->lock);
    property_table_free(&propdata->prop_names);
    property_table_free(&propdata->prop_values);
    propdata->prop_name_idx = propdata->prop_value_idx = 0;

    OPENSSL_free(propdata);
}